

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O1

Own<const_kj::FsNode,_std::nullptr_t> __thiscall
kj::anon_unknown_59::AppendableFileImpl::cloneFsNode(AppendableFileImpl *this)

{
  _func_int *p_Var1;
  _func_int **pp_Var2;
  FsNode *extraout_RDX;
  long in_RSI;
  _func_int *p_Var3;
  _func_int *p_Var4;
  Own<const_kj::FsNode,_std::nullptr_t> OVar5;
  _func_int *local_28;
  _func_int *local_20;
  
  (**(code **)(**(long **)(in_RSI + 0x18) + 0x28))(&local_28);
  p_Var3 = local_20;
  if (local_20 == (_func_int *)0x0) {
    p_Var4 = (_func_int *)0x0;
    p_Var3 = (_func_int *)0x0;
  }
  else {
    local_20 = (_func_int *)0x0;
    p_Var4 = local_28;
  }
  p_Var1 = local_20;
  if (local_20 != (_func_int *)0x0) {
    local_20 = (_func_int *)0x0;
    (*(code *)**(undefined8 **)local_28)(local_28,p_Var1 + *(long *)(*(long *)p_Var1 + -0x10));
  }
  pp_Var2 = (_func_int **)operator_new(0x20);
  *pp_Var2 = (_func_int *)&PTR_getFd_0070fba0;
  pp_Var2[1] = (_func_int *)&PTR__AppendableFileImpl_0070fbf8;
  pp_Var2[2] = p_Var4;
  pp_Var2[3] = p_Var3;
  (this->super_AppendableFile).super_FsNode._vptr_FsNode =
       (_func_int **)&kj::_::HeapDisposer<kj::(anonymous_namespace)::AppendableFileImpl>::instance;
  (this->super_AppendableFile).super_OutputStream._vptr_OutputStream = pp_Var2;
  OVar5.ptr = extraout_RDX;
  OVar5.disposer = (Disposer *)this;
  return OVar5;
}

Assistant:

Own<const FsNode> cloneFsNode() const override {
    return heap<AppendableFileImpl>(file->clone());
  }